

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int test_wildcard(char *name,_Bool cmdline)

{
  int iVar1;
  uint uVar2;
  glob_t globbed;
  stat statbuf;
  
  iVar1 = stat(name,(stat *)&statbuf);
  if (cmdline || iVar1 == 0) {
    uVar2 = (uint)(iVar1 == 0);
  }
  else {
    uVar2 = 0;
    iVar1 = glob(name,1,(__errfunc *)0x0,(glob_t *)&globbed);
    if (iVar1 == 0) {
      uVar2 = (uint)(globbed.gl_pathc != 0) * 2;
      globfree((glob_t *)&globbed);
    }
  }
  return uVar2;
}

Assistant:

int test_wildcard(const char *name, bool cmdline)
{
    struct stat statbuf;

    if (stat(name, &statbuf) == 0) {
        return WCTYPE_FILENAME;
    } else if (cmdline) {
        /*
         * On Unix, we never need to parse wildcards coming from
         * the command line, because the shell will have expanded
         * them into a filename list already.
         */
        return WCTYPE_NONEXISTENT;
    } else {
#if HAVE_GLOB_H
        glob_t globbed;
        int ret = WCTYPE_NONEXISTENT;

        if (glob(name, GLOB_ERR, NULL, &globbed) == 0) {
            if (globbed.gl_pathc > 0)
                ret = WCTYPE_WILDCARD;
            globfree(&globbed);
        }

        return ret;
#else
        /* On a system without glob.h, we just have to return a
         * failure code */
        return WCTYPE_NONEXISTENT;
#endif
    }
}